

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O2

void __thiscall
pstore::error_or<std::tuple<int,_pstore::http::frame>_>::~error_or
          (error_or<std::tuple<int,_pstore::http::frame>_> *this)

{
  tuple<int,_pstore::http::frame> *ptVar1;
  
  if (this->has_error_ == false) {
    ptVar1 = error_or<std::tuple<int,pstore::http::frame>>::
             value_storage_impl<pstore::error_or<std::tuple<int,pstore::http::frame>>&,std::tuple<int,pstore::http::frame>>
                       (this);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&(ptVar1->super__Tuple_impl<0UL,_int,_pstore::http::frame>).
                super__Tuple_impl<1UL,_pstore::http::frame>.
                super__Head_base<1UL,_pstore::http::frame,_false>._M_head_impl.payload.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  if (this->has_error_ != false) {
    return;
  }
  assert_failed("e.has_error_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/error_or.hpp"
                ,0xd3);
}

Assistant:

error_or<T>::~error_or () {
        if (!has_error_) {
            get_storage ()->~storage_type ();
        } else {
            using error_code = std::error_code;
            get_error_storage ()->~error_code ();
        }
    }